

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapetriang.cpp
# Opt level: O2

void pzshape::TPZShapeTriang::ShapeCorner
               (TPZVec<double> *pt,TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi)

{
  double dVar1;
  double dVar2;
  double *pdVar3;
  
  dVar1 = *pt->fStore;
  dVar2 = pt->fStore[1];
  pdVar3 = TPZFMatrix<double>::operator()(phi,0,0);
  *pdVar3 = (1.0 - dVar1) - dVar2;
  dVar1 = *pt->fStore;
  pdVar3 = TPZFMatrix<double>::operator()(phi,1,0);
  *pdVar3 = dVar1;
  dVar1 = pt->fStore[1];
  pdVar3 = TPZFMatrix<double>::operator()(phi,2,0);
  *pdVar3 = dVar1;
  pdVar3 = TPZFMatrix<double>::operator()(dphi,0,0);
  *pdVar3 = -1.0;
  pdVar3 = TPZFMatrix<double>::operator()(dphi,1,0);
  *pdVar3 = -1.0;
  pdVar3 = TPZFMatrix<double>::operator()(dphi,0,1);
  *pdVar3 = 1.0;
  pdVar3 = TPZFMatrix<double>::operator()(dphi,1,1);
  *pdVar3 = 0.0;
  pdVar3 = TPZFMatrix<double>::operator()(dphi,0,2);
  *pdVar3 = 0.0;
  pdVar3 = TPZFMatrix<double>::operator()(dphi,1,2);
  *pdVar3 = 1.0;
  return;
}

Assistant:

void TPZShapeTriang::ShapeCorner(const TPZVec<REAL> &pt, TPZFMatrix<REAL> &phi, TPZFMatrix<REAL> &dphi) {
		
		phi(0,0) =  1.-pt[0]-pt[1];
		phi(1,0) =  pt[0];
		phi(2,0) =  pt[1];
		dphi(0,0) = -1.;
		dphi(1,0) = -1.;
		dphi(0,1) =  1.;
		dphi(1,1) =  0.;
		dphi(0,2) =  0.;
		dphi(1,2) =  1.;
	}